

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O1

void init_adf_data(cbify *data,size_t num_actions)

{
  example *peVar1;
  cbify_adf_data *this;
  size_t sVar2;
  
  (data->adf_data).num_actions = num_actions;
  this = &data->adf_data;
  std::vector<example_*,_std::allocator<example_*>_>::resize(&this->ecs,num_actions);
  if (num_actions != 0) {
    sVar2 = 0;
    do {
      peVar1 = VW::alloc_examples(DAT_0030bbd8,1);
      (this->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_start[sVar2] = peVar1;
      (*(code *)CB::cb_label)
                (&(this->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar2]->l);
      sVar2 = sVar2 + 1;
    } while (num_actions != sVar2);
  }
  return;
}

Assistant:

void init_adf_data(cbify& data, const size_t num_actions)
{
  auto& adf_data = data.adf_data;
  adf_data.num_actions = num_actions;

  adf_data.ecs.resize(num_actions);
  for (size_t a = 0; a < num_actions; ++a)
  {
    adf_data.ecs[a] = VW::alloc_examples(CB::cb_label.label_size, 1);
    auto& lab = adf_data.ecs[a]->l.cb;
    CB::cb_label.default_label(&lab);
  }
}